

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

void __thiscall icu_63::Package::~Package(Package *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  uprv_free_63(this->inData);
  iVar1 = this->itemCount;
  if (0 < iVar1) {
    lVar2 = 0x14;
    lVar3 = 0;
    do {
      if (*(char *)((long)&this->items->name + lVar2) != '\0') {
        uprv_free_63(*(void **)((long)this->items + lVar2 + -0xc));
        iVar1 = this->itemCount;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < iVar1);
  }
  uprv_free_63(this->items);
  return;
}

Assistant:

Package::~Package() {
    int32_t idx;

    uprv_free(inData);

    for(idx=0; idx<itemCount; ++idx) {
        if(items[idx].isDataOwned) {
            uprv_free(items[idx].data);
        }
    }

    uprv_free((void*)items);
}